

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O0

void test_to_number<unsigned_long_long>
               (char *str,unsigned_long_long wanted,bool error,_func_unsigned_long_long_char_ptr *fn
               )

{
  ostream *poVar1;
  void *this;
  runtime_error *e;
  string local_58 [8];
  string msg;
  unsigned_long_long result;
  bool worked;
  bool threw;
  _func_unsigned_long_long_char_ptr *fn_local;
  bool error_local;
  unsigned_long_long wanted_local;
  char *str_local;
  
  msg.field_2._8_8_ = 0;
  std::__cxx11::string::string(local_58);
  msg.field_2._8_8_ = (*fn)(str);
  if (wanted == msg.field_2._8_8_) {
    poVar1 = std::operator<<((ostream *)&std::cout,str);
    poVar1 = std::operator<<(poVar1," to int: PASSED");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,str);
    poVar1 = std::operator<<(poVar1," to int failed; got ");
    this = (void *)std::ostream::operator<<(poVar1,msg.field_2._8_8_);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void
test_to_number(char const* str, int_T wanted, bool error, int_T (*fn)(char const*))
{
    bool threw = false;
    bool worked = false;
    int_T result = 0;
    std::string msg;
    try {
        result = fn(str);
        worked = (wanted == result);
    } catch (std::runtime_error const& e) {
        threw = true;
        msg = e.what();
    }
    if (threw) {
        if (error) {
            std::cout << str << " to int threw (" << msg << "): PASSED" << std::endl;
        } else {
            std::cout << str << " to int threw but wanted " << wanted << std::endl;
        }
    } else {
        if (worked) {
            std::cout << str << " to int: PASSED" << std::endl;
        } else {
            std::cout << str << " to int failed; got " << result << std::endl;
        }
    }
}